

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void setOutputFile(QString *file,QString *format)

{
  long lVar1;
  ulong uVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  bool bVar6;
  QString *pQVar7;
  long in_FS_OFFSET;
  QLatin1String QVar8;
  QAnyStringView QVar9;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  QArrayDataPointer<char16_t> *local_38;
  undefined8 local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((format->d).size == 0) {
    QVar8.m_data = "txt";
    QVar8.m_size = 3;
    QString::operator=(format,QVar8);
  }
  lVar1 = (file->d).size;
  if ((lVar1 == 0) || ((lVar1 == 1 && (*(file->d).ptr == L'-')))) {
    bVar6 = QHash<QString,_QString>::contains(&g_options.outFiles,format);
    if (bVar6) {
      QHash<QString,_QString>::value((QString *)&local_58,&g_options.outFiles,format);
      pDVar4 = (file->d).d;
      pcVar5 = (file->d).ptr;
      (file->d).d = local_58.d;
      (file->d).ptr = local_58.ptr;
      uVar2 = (file->d).size;
      (file->d).size = local_58.size;
      local_58.d = pDVar4;
      local_58.ptr = pcVar5;
      local_58.size = uVar2;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    }
    else {
      local_58.ptr = (format->d).ptr;
      local_58.size = (format->d).size | 0x8000000000000000;
      local_38 = &local_58;
      local_58.d = (Data *)CONCAT71(local_58.d._1_7_,1);
      local_30 = 0;
      QVar9.m_size = (size_t)"stdout.%1";
      QVar9.field_0.m_data = &local_78;
      QtPrivate::argToQString(QVar9,0x4000000000000009,(ArgBase **)0x1);
      pDVar4 = (file->d).d;
      pcVar5 = (file->d).ptr;
      (file->d).d = local_78.d;
      (file->d).ptr = local_78.ptr;
      qVar3 = (file->d).size;
      (file->d).size = local_78.size;
      local_78.d = pDVar4;
      local_78.ptr = pcVar5;
      local_78.size = qVar3;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      pQVar7 = QHash<QString,_QString>::operator[](&g_options.outFiles,format);
      QString::operator=(pQVar7,(QString *)file);
    }
    QFileInfo::QFileInfo((QFileInfo *)&local_78,(QString *)file);
    QFileInfo::fileName();
    qVar3 = g_options.stdoutFileName.d.size;
    pcVar5 = g_options.stdoutFileName.d.ptr;
    pDVar4 = g_options.stdoutFileName.d.d;
    g_options.stdoutFileName.d.d = local_58.d;
    g_options.stdoutFileName.d.ptr = local_58.ptr;
    local_58.d = pDVar4;
    local_58.ptr = pcVar5;
    g_options.stdoutFileName.d.size = local_58.size;
    local_58.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QFileInfo::~QFileInfo((QFileInfo *)&local_78);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else {
    pQVar7 = QHash<QString,_QString>::operator[](&g_options.outFiles,format);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QString::operator=(pQVar7,(QString *)file);
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

static void setOutputFile(QString file, QString format)
{
    if (format.isEmpty())
        format = "txt"_L1;

    if ((file.isEmpty() || file == u'-')) {
        if (g_options.outFiles.contains(format)) {
            file = g_options.outFiles.value(format);
        } else {
            file = "stdout.%1"_L1.arg(format);
            g_options.outFiles[format] = file;
        }
        g_options.stdoutFileName = QFileInfo(file).fileName();
    } else {
        g_options.outFiles[format] = file;
    }
}